

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

string * getLinuxFolderDefault_abi_cxx11_
                   (string *__return_storage_ptr__,char *envName,char *defaultRelativePath)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_30;
  char *tempRes;
  char *local_20;
  char *defaultRelativePath_local;
  char *envName_local;
  string *res;
  
  tempRes._7_1_ = 0;
  local_20 = defaultRelativePath;
  defaultRelativePath_local = envName;
  envName_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = getenv(defaultRelativePath_local);
  if (local_30 == (char *)0x0) {
    sago::internal::getHome_abi_cxx11_();
    std::operator+(&local_80,&local_a0,"/");
    std::operator+(&local_60,&local_80,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    throwOnRelative(defaultRelativePath_local,local_30);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLinuxFolderDefault(const char* envName, const char* defaultRelativePath) {
	std::string res;
	const char* tempRes = std::getenv(envName);
	if (tempRes) {
		throwOnRelative(envName, tempRes);
		res = tempRes;
		return res;
	}
	res = sago::internal::getHome() + "/" + defaultRelativePath;
	return res;
}